

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_point.cpp
# Opt level: O0

int ON_ParsePointExpression
              (wchar_t *str,int str_count,ON_ParseSettings parse_settings,
              LengthUnitSystem point_value_unit_system,ON_3dPoint *point_value,
              ON_ParseSettings *parse_results)

{
  ON__UINT16 OVar1;
  ON__UINT8 OVar2;
  ON__UINT8 OVar3;
  ON_ParseSettings OVar4;
  int iVar5;
  bool bVar6;
  bool local_219;
  ON_ParseSettings local_210;
  ON_ParseSettings local_1f0;
  double local_1d0;
  double tan_a;
  double local_1c0;
  ON__UINT32 local_1b8 [2];
  ON__UINT32 local_1b0 [2];
  undefined8 local_1a8;
  ON__UINT64 local_1a0;
  ON__UINT32 local_198 [2];
  ON__UINT32 local_190 [2];
  undefined8 local_188;
  ON__UINT64 local_180;
  int local_174;
  undefined1 auStack_170 [4];
  int i3;
  double local_168;
  ON__UINT32 local_160 [2];
  ON__UINT32 local_158 [2];
  undefined8 local_150;
  ON__UINT64 local_148;
  ON_2dVector local_140;
  ON__UINT32 local_130 [2];
  ON__UINT32 local_128 [2];
  undefined8 local_120;
  ON__UINT64 local_118;
  int local_10c;
  ON__UINT32 aOStack_108 [2];
  int i2;
  ON__UINT32 local_100 [2];
  undefined8 local_f8;
  ON__UINT64 local_f0;
  int local_e8;
  int local_e4;
  int i1;
  int i0;
  undefined1 auStack_d8 [3];
  bool bPolarAngle;
  int str_index;
  ON_ParseSettings prz;
  ON_ParseSettings pry;
  ON_ParseSettings prx;
  double spherical_angle;
  double polar_angle;
  double r;
  double z;
  double y;
  double x;
  ON_2dVector cos_sin_a1;
  ON_2dVector cos_sin_a0;
  ON_ParseSettings *parse_results_local;
  ON_3dPoint *point_value_local;
  LengthUnitSystem point_value_unit_system_local;
  int str_count_local;
  wchar_t *str_local;
  
  y = -1.23432101234321e+308;
  z = -1.23432101234321e+308;
  r = 0.0;
  polar_angle = -1.23432101234321e+308;
  spherical_angle = -1.23432101234321e+308;
  prx.m_reserved = 0xffe5f8bd9e331dd2;
  if (point_value != (ON_3dPoint *)0x0) {
    point_value->x = ON_3dPoint::Origin.x;
    point_value->y = ON_3dPoint::Origin.y;
    point_value->z = ON_3dPoint::Origin.z;
  }
  if (parse_results != (ON_ParseSettings *)0x0) {
    *&parse_results->m_true_default_bits = ON_ParseSettings::FalseSettings.m_true_default_bits;
    *&parse_results->m_false_default_bits = ON_ParseSettings::FalseSettings.m_false_default_bits;
    OVar1 = ON_ParseSettings::FalseSettings.m_context_locale_id;
    OVar2 = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
    OVar3 = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
    parse_results->m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
    parse_results->m_context_locale_id = OVar1;
    parse_results->m_context_angle_unit_system = OVar2;
    parse_results->m_context_length_unit_system = OVar3;
    parse_results->m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
  }
  pry.m_reserved._0_4_ = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
  pry.m_reserved._4_4_ = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
  prx.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
  prx.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
  prx.m_false_default_bits = (ON__UINT32  [2])ON_ParseSettings::FalseSettings._16_8_;
  prx.m_reserved_bits = (undefined4)ON_ParseSettings::FalseSettings.m_reserved;
  prx.m_context_locale_id = ON_ParseSettings::FalseSettings.m_reserved._4_2_;
  prx.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_reserved._6_1_;
  prx.m_context_length_unit_system = ON_ParseSettings::FalseSettings.m_reserved._7_1_;
  prz.m_reserved._0_4_ = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
  prz.m_reserved._4_4_ = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
  pry.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
  pry.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
  pry.m_false_default_bits = (ON__UINT32  [2])ON_ParseSettings::FalseSettings._16_8_;
  pry.m_reserved_bits = (undefined4)ON_ParseSettings::FalseSettings.m_reserved;
  pry.m_context_locale_id = ON_ParseSettings::FalseSettings.m_reserved._4_2_;
  pry.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_reserved._6_1_;
  pry.m_context_length_unit_system = ON_ParseSettings::FalseSettings.m_reserved._7_1_;
  _auStack_d8 = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
  str_index = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
  prz.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
  prz.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
  prz.m_false_default_bits = (ON__UINT32  [2])ON_ParseSettings::FalseSettings._16_8_;
  prz.m_reserved_bits = (undefined4)ON_ParseSettings::FalseSettings.m_reserved;
  prz.m_context_locale_id = ON_ParseSettings::FalseSettings.m_reserved._4_2_;
  prz.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_reserved._6_1_;
  prz.m_context_length_unit_system = ON_ParseSettings::FalseSettings.m_reserved._7_1_;
  i0 = 0;
  i1._3_1_ = 0;
  point_value_local._4_4_ = str_count;
  if (str_count == -1) {
    point_value_local._4_4_ = 0x7ffffffd;
  }
  iVar5 = i0;
  if (0 < point_value_local._4_4_) {
    local_e4 = 0;
    bVar6 = ON_ParseSettings::ParseLeadingWhiteSpace(&parse_settings);
    if (bVar6) {
      while( true ) {
        local_219 = false;
        if (local_e4 < point_value_local._4_4_) {
          local_219 = ON_ParseSettings::IsLeadingWhiteSpace(&parse_settings,str[local_e4]);
        }
        if (local_219 == false) break;
        local_e4 = local_e4 + 1;
      }
      iVar5 = i0;
      if (point_value_local._4_4_ <= local_e4) goto LAB_007bcd2a;
      ON_ParseSettings::SetParseLeadingWhiteSpace(&parse_settings,false);
    }
    OVar4 = parse_settings;
    aOStack_108[0] = parse_settings.m_true_default_bits[0];
    aOStack_108[1] = parse_settings.m_true_default_bits[1];
    parse_settings.m_false_default_bits = OVar4.m_false_default_bits;
    local_100[0] = parse_settings.m_false_default_bits[0];
    local_100[1] = parse_settings.m_false_default_bits[1];
    parse_settings._16_8_ = OVar4._16_8_;
    local_f8._0_4_ = parse_settings.m_reserved_bits;
    local_f8._4_2_ = parse_settings.m_context_locale_id;
    local_f8._6_1_ = parse_settings.m_context_angle_unit_system;
    local_f8._7_1_ = parse_settings.m_context_length_unit_system;
    parse_settings.m_reserved = OVar4.m_reserved;
    local_f0 = parse_settings.m_reserved;
    parse_settings = OVar4;
    local_e8 = ON_ParseLengthExpression
                         (str + local_e4,point_value_local._4_4_ - local_e4,OVar4,
                          point_value_unit_system,&y,(ON_ParseSettings *)&pry.m_reserved,
                          (LengthUnitSystem *)0x0);
    OVar4 = parse_settings;
    iVar5 = i0;
    if (0 < local_e8) {
      local_e8 = local_e4 + local_e8;
      if ((((local_e8 != point_value_local._4_4_) || (local_e4 + 1 != local_e8)) ||
          (str[local_e4] != L'0')) || ((y != 0.0 || (NAN(y))))) {
        if ((local_e8 < point_value_local._4_4_) &&
           (((point_value_local._4_4_ < local_e8 + 2 || (str[local_e8] != L',')) ||
            ((str[local_e8 + 1] != L'<' ||
             (local_e8 = local_e8 + 1, local_e8 < point_value_local._4_4_)))))) {
          if (str[local_e8] == L',') {
            if (str[local_e8] == L'<') {
              i1._3_1_ = 1;
              polar_angle = y;
              y = -1.23432101234321e+308;
              local_e8 = local_e8 + 1;
              if (point_value_local._4_4_ <= local_e8) goto LAB_007bcd2a;
              local_160[0] = parse_settings.m_true_default_bits[0];
              local_160[1] = parse_settings.m_true_default_bits[1];
              local_158[0] = parse_settings.m_false_default_bits[0];
              local_158[1] = parse_settings.m_false_default_bits[1];
              local_150._0_4_ = parse_settings.m_reserved_bits;
              local_150._4_2_ = parse_settings.m_context_locale_id;
              local_150._6_1_ = parse_settings.m_context_angle_unit_system;
              local_150._7_1_ = parse_settings.m_context_length_unit_system;
              local_148 = parse_settings.m_reserved;
              parse_settings = OVar4;
              local_10c = ON_ParseAngleExpression
                                    (str + local_e8,point_value_local._4_4_ - local_e8,OVar4,Radians
                                     ,&spherical_angle,(ON_ParseSettings *)&prz.m_reserved,
                                     (AngleUnitSystem *)0x0);
              iVar5 = i0;
              if ((((local_10c < 1) || (point_value_local._4_4_ < local_e8 + local_e4)) ||
                  (bVar6 = ON_IsValid(spherical_angle), iVar5 = i0, !bVar6)) ||
                 (bVar6 = ON_IsValid(polar_angle), iVar5 = i0, !bVar6)) goto LAB_007bcd2a;
              _auStack_170 = CosineAndSine(spherical_angle);
              cos_sin_a1.y = _auStack_170;
              y = polar_angle * _auStack_170;
              z = polar_angle * local_168;
            }
            else {
              if (((local_e4 + 1 == local_e8) && (str[local_e4] == L'0')) &&
                 ((y == 0.0 && (!NAN(y))))) {
                z = 0.0;
                i0 = local_e8;
                prz.m_reserved._0_4_ = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
                prz.m_reserved._4_4_ = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
                pry.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0]
                ;
                pry.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1]
                ;
                pry.m_false_default_bits = (ON__UINT32  [2])ON_ParseSettings::FalseSettings._16_8_;
                pry.m_reserved_bits = (undefined4)ON_ParseSettings::FalseSettings.m_reserved;
                pry.m_context_locale_id = ON_ParseSettings::FalseSettings.m_reserved._4_2_;
                pry.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_reserved._6_1_;
                pry.m_context_length_unit_system = ON_ParseSettings::FalseSettings.m_reserved._7_1_;
                iVar5 = i0;
                goto LAB_007bcd2a;
              }
              local_10c = 0;
            }
          }
          else {
            local_e8 = local_e8 + 1;
            if (point_value_local._4_4_ <= local_e8) goto LAB_007bcd2a;
            local_130[0] = parse_settings.m_true_default_bits[0];
            local_130[1] = parse_settings.m_true_default_bits[1];
            local_128[0] = parse_settings.m_false_default_bits[0];
            local_128[1] = parse_settings.m_false_default_bits[1];
            local_120._0_4_ = parse_settings.m_reserved_bits;
            local_120._4_2_ = parse_settings.m_context_locale_id;
            local_120._6_1_ = parse_settings.m_context_angle_unit_system;
            local_120._7_1_ = parse_settings.m_context_length_unit_system;
            local_118 = parse_settings.m_reserved;
            parse_settings = OVar4;
            local_10c = ON_ParseLengthExpression
                                  (str + local_e8,point_value_local._4_4_ - local_e8,OVar4,
                                   point_value_unit_system,&z,(ON_ParseSettings *)&prz.m_reserved,
                                   (LengthUnitSystem *)0x0);
            if (((0 < local_10c) && (local_e8 + local_e4 <= point_value_local._4_4_)) &&
               ((bVar6 = ON_IsValid(y), bVar6 && (bVar6 = ON_IsValid(z), bVar6)))) {
              ON_2dVector::ON_2dVector(&local_140,y,z);
              polar_angle = ON_2dVector::Length(&local_140);
            }
          }
          OVar4 = parse_settings;
          iVar5 = i0;
          if (((0 < local_10c) &&
              (local_10c = local_e8 + local_10c, iVar5 = local_10c,
              local_10c < point_value_local._4_4_)) &&
             ((point_value_local._4_4_ < local_10c + 2 ||
              (((str[local_10c] != L',' || (str[local_10c + 1] != L'<')) ||
               (local_10c = local_10c + 1, iVar5 = i0, local_10c < point_value_local._4_4_)))))) {
            if (str[local_10c] == L',') {
              local_10c = local_10c + 1;
              iVar5 = i0;
              if (point_value_local._4_4_ <= local_10c) goto LAB_007bcd2a;
              local_198[0] = parse_settings.m_true_default_bits[0];
              local_198[1] = parse_settings.m_true_default_bits[1];
              local_190[0] = parse_settings.m_false_default_bits[0];
              local_190[1] = parse_settings.m_false_default_bits[1];
              local_188._0_4_ = parse_settings.m_reserved_bits;
              local_188._4_2_ = parse_settings.m_context_locale_id;
              local_188._6_1_ = parse_settings.m_context_angle_unit_system;
              local_188._7_1_ = parse_settings.m_context_length_unit_system;
              local_180 = parse_settings.m_reserved;
              parse_settings = OVar4;
              local_174 = ON_ParseLengthExpression
                                    (str + local_10c,point_value_local._4_4_ - local_10c,OVar4,
                                     point_value_unit_system,&r,(ON_ParseSettings *)auStack_d8,
                                     (LengthUnitSystem *)0x0);
            }
            else {
              if (str[local_10c] != L'<') {
                i0 = local_10c;
                iVar5 = i0;
                goto LAB_007bcd2a;
              }
              local_1b8[0] = parse_settings.m_true_default_bits[0];
              local_1b8[1] = parse_settings.m_true_default_bits[1];
              local_1b0[0] = parse_settings.m_false_default_bits[0];
              local_1b0[1] = parse_settings.m_false_default_bits[1];
              local_1a8._0_4_ = parse_settings.m_reserved_bits;
              local_1a8._4_2_ = parse_settings.m_context_locale_id;
              local_1a8._6_1_ = parse_settings.m_context_angle_unit_system;
              local_1a8._7_1_ = parse_settings.m_context_length_unit_system;
              local_1a0 = parse_settings.m_reserved;
              parse_settings = OVar4;
              local_174 = ON_ParseAngleExpression
                                    (str + local_10c,point_value_local._4_4_ - local_10c,OVar4,
                                     Radians,(double *)&prx.m_reserved,
                                     (ON_ParseSettings *)auStack_d8,(AngleUnitSystem *)0x0);
              iVar5 = i0;
              if (((local_174 < 1) || (point_value_local._4_4_ < local_10c + local_174)) ||
                 ((bVar6 = ON_IsValid((double)prx.m_reserved), iVar5 = i0, !bVar6 ||
                  ((bVar6 = ON_IsValid(polar_angle), iVar5 = i0, !bVar6 || (polar_angle < 0.0))))))
              goto LAB_007bcd2a;
              _tan_a = CosineAndSine((double)prx.m_reserved);
              x = tan_a;
              cos_sin_a1.x = local_1c0;
              iVar5 = i0;
              if ((i1._3_1_ & 1) == 0) {
                if (tan_a <= 0.0) goto LAB_007bcd2a;
                local_1d0 = tan((double)prx.m_reserved);
                bVar6 = ON_IsValid(local_1d0);
                iVar5 = i0;
                if (!bVar6) goto LAB_007bcd2a;
                r = polar_angle * local_1d0;
              }
              else {
                if (tan_a < 0.0) goto LAB_007bcd2a;
                y = polar_angle * tan_a;
                z = polar_angle * tan_a;
                r = polar_angle * local_1c0;
              }
            }
            iVar5 = i0;
            if ((0 < local_174) &&
               (local_174 = local_10c + local_174, iVar5 = local_174,
               point_value_local._4_4_ < local_174)) {
              iVar5 = i0;
            }
          }
        }
      }
      else {
        z = 0.0;
        r = 0.0;
        iVar5 = local_e4 + local_e8;
      }
    }
  }
LAB_007bcd2a:
  i0 = iVar5;
  if (i0 < 1) {
    bVar6 = ON_ParseSettings::ParseError((ON_ParseSettings *)&pry.m_reserved);
    if (!bVar6) {
      pry.m_reserved._0_4_ = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
      pry.m_reserved._4_4_ = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
      prx.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
      prx.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
      prx.m_false_default_bits = (ON__UINT32  [2])ON_ParseSettings::FalseSettings._16_8_;
      prx.m_reserved_bits = (undefined4)ON_ParseSettings::FalseSettings.m_reserved;
      prx.m_context_locale_id = ON_ParseSettings::FalseSettings.m_reserved._4_2_;
      prx.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_reserved._6_1_;
      prx.m_context_length_unit_system = ON_ParseSettings::FalseSettings.m_reserved._7_1_;
    }
    bVar6 = ON_ParseSettings::ParseError((ON_ParseSettings *)&prz.m_reserved);
    if (!bVar6) {
      prz.m_reserved._0_4_ = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
      prz.m_reserved._4_4_ = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
      pry.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
      pry.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
      pry.m_false_default_bits = (ON__UINT32  [2])ON_ParseSettings::FalseSettings._16_8_;
      pry.m_reserved_bits = (undefined4)ON_ParseSettings::FalseSettings.m_reserved;
      pry.m_context_locale_id = ON_ParseSettings::FalseSettings.m_reserved._4_2_;
      pry.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_reserved._6_1_;
      pry.m_context_length_unit_system = ON_ParseSettings::FalseSettings.m_reserved._7_1_;
    }
    bVar6 = ON_ParseSettings::ParseError((ON_ParseSettings *)auStack_d8);
    if (!bVar6) {
      _auStack_d8 = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
      str_index = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
      prz.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
      prz.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
      prz.m_false_default_bits = (ON__UINT32  [2])ON_ParseSettings::FalseSettings._16_8_;
      prz.m_reserved_bits = (undefined4)ON_ParseSettings::FalseSettings.m_reserved;
      prz.m_context_locale_id = ON_ParseSettings::FalseSettings.m_reserved._4_2_;
      prz.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_reserved._6_1_;
      prz.m_context_length_unit_system = ON_ParseSettings::FalseSettings.m_reserved._7_1_;
    }
  }
  else if (point_value != (ON_3dPoint *)0x0) {
    point_value->x = y;
    point_value->y = z;
    point_value->z = r;
  }
  if (parse_results != (ON_ParseSettings *)0x0) {
    operator||(&local_210,(ON_ParseSettings *)&pry.m_reserved,(ON_ParseSettings *)&prz.m_reserved);
    operator||(&local_1f0,&local_210,(ON_ParseSettings *)auStack_d8);
    *&parse_results->m_true_default_bits = local_1f0.m_true_default_bits;
    *&parse_results->m_false_default_bits = local_1f0.m_false_default_bits;
    parse_results->m_reserved_bits = local_1f0.m_reserved_bits;
    parse_results->m_context_locale_id = local_1f0.m_context_locale_id;
    parse_results->m_context_angle_unit_system = local_1f0.m_context_angle_unit_system;
    parse_results->m_context_length_unit_system = local_1f0.m_context_length_unit_system;
    parse_results->m_reserved = local_1f0.m_reserved;
  }
  return i0;
}

Assistant:

int ON_ParsePointExpression(
  const wchar_t* str,
  int str_count,
  ON_ParseSettings parse_settings,
  ON::LengthUnitSystem point_value_unit_system,
  ON_3dPoint* point_value,
  ON_ParseSettings* parse_results
  )
{
  ON_2dVector cos_sin_a0, cos_sin_a1;
  double x = ON_UNSET_VALUE, y = ON_UNSET_VALUE, z = 0.0;
  double r = ON_UNSET_VALUE, polar_angle = ON_UNSET_VALUE, spherical_angle = ON_UNSET_VALUE;

  if ( point_value )
    *point_value = ON_3dPoint::Origin;
  if ( parse_results)
    *parse_results = ON_ParseSettings::FalseSettings;

  ON_ParseSettings prx(ON_ParseSettings::FalseSettings);
  ON_ParseSettings pry(ON_ParseSettings::FalseSettings);
  ON_ParseSettings prz(ON_ParseSettings::FalseSettings);

  int str_index = 0;

  bool bPolarAngle = false;

  for(;;)
  {
    if ( -1 == str_count )
      str_count = ON_ParseSettings::max_expression_str_count;

    if ( str_count <= 0 )
      break;

    int i0 = 0;
    if ( parse_settings.ParseLeadingWhiteSpace() )
    {
      while ( i0 < str_count && parse_settings.IsLeadingWhiteSpace(str[i0]) )
        i0++;
      if ( i0 >= str_count )
        break;
     parse_settings.SetParseLeadingWhiteSpace(false);
    }

    int i1 = ON_ParseLengthExpression(
      str+i0, str_count-i0,
      parse_settings,
      point_value_unit_system,
      &x,
      &prx,
      0
      );
    if ( i1 < 1)
      break;

    i1 += i0;
    if ( i1 == str_count && i0+1 == i1 && '0' == str[i0] && 0.0 == x )
    {
      // world origin specified as a single zero.
      y = 0.0;
      z = 0.0;
      str_index = i0+i1;
      break;
    }

    if ( i1 >= str_count )
      break;

    if ( i1+2 <= str_count && str[i1] == ',' && str[i1+1] == '<' )
    {
      // It is a common for people to type "d,<a" instead of "d<a"
      // and this clause allows them to do it.
      i1++;
      if ( i1 >= str_count)
        break;
    }

    int i2;
    if ( str[i1] != ',' )
    {
      i1++;
      if ( i1 >= str_count )
        break;
      i2 = ON_ParseLengthExpression(
            str+i1, str_count-i1,
            parse_settings,
            point_value_unit_system,
            &y,
            &pry,
            0
            );
      if ( i2 > 0 && i1+i0 <= str_count && ON_IsValid(x) && ON_IsValid(y) )
      {
        r = ON_2dVector(x,y).Length();
      }
    }
    else if ( str[i1] == '<' )
    {
      bPolarAngle = true;
      r = x;
      x = ON_UNSET_VALUE;
      i1++;
      if ( i1 >= str_count )
        break;
      i2 = ON_ParseAngleExpression(
            str+i1, str_count-i1,
            parse_settings,
            ON::AngleUnitSystem::Radians,
            &polar_angle,
            &pry,
            0
            );
      if ( i2 > 0 && i1+i0 <= str_count && ON_IsValid(polar_angle) && ON_IsValid(r) )
      {
        cos_sin_a0 = CosineAndSine(polar_angle);
        x = r*cos_sin_a0.x;
        y = r*cos_sin_a0.y;
      }
      else
      {
        break;
      }
    }
    else if ( i0+1 == i1 && '0' == str[i0] && 0.0 == x )
    {
      // single 0 for origin
      y = 0.0;
      str_index = i1;
      pry = ON_ParseSettings::FalseSettings;
      break;
    }
    else
    {
      i2 = 0;
    }

    if ( i2 <= 0 )
      break;

    i2 += i1;

    if ( i2 >= str_count )
    {
      // 2d point
      str_index = i2;
      break;
    }

    if ( i2+2 <= str_count && str[i2] == ',' && str[i2+1] == '<' )
    {
      // It is a common for people to type "x,y,<a" instead of "x,y<a"
      // and this clause allows them to do it.
      i2++;
      if ( i2 >= str_count )
        break;
    }

    int i3;
    if ( str[i2] == ',' ) 
    {
      i2++;
      if ( i2 >= str_count )
        break;
      i3 = ON_ParseLengthExpression(
        str+i2, str_count-i2,
        parse_settings,
        point_value_unit_system,
        &z,
        &prz,
        0
        );
    }
    else if (  str[i2] == '<' )
    {
      // spherical angle
      i3 = ON_ParseAngleExpression(
        str+i2, str_count-i2,
        parse_settings,
        ON::AngleUnitSystem::Radians,
        &spherical_angle,
        &prz,
        0
        );
      if ( i3 <= 0 || i2+i3 > str_count )
        break;
      if ( !ON_IsValid(spherical_angle) || !ON_IsValid(r) || !(r >= 0.0) )
        break;
      cos_sin_a1 = CosineAndSine(spherical_angle);
      if ( bPolarAngle )
      {
        // spherical coordinates (r<a<e)
        if ( cos_sin_a1.x >= 0.0 )
        {
          x = r*cos_sin_a1.x; 
          y = r*cos_sin_a1.x;
          z = r*cos_sin_a1.y;
        }
        else
        {
          break;
        }
      }
      else if ( cos_sin_a1.x > 0.0 )
      {
        // elevation (x,y<e)
        double tan_a = tan(spherical_angle);
        if ( ON_IsValid(tan_a) )
          z = r*tan_a;
        else
          break;
      }
      else
      {
        break;
      }
    }
    else
    {
      // 2d point
      str_index = i2;
      break;
    }

    if ( i3 <= 0 )
      break;
    i3 += i2;
    if ( i3 > str_count )
      break;

    str_index = i3;
    break;
  }

  if ( str_index > 0 )
  {
    if ( point_value )
    {
      point_value->x = x;
      point_value->y = y;
      point_value->z = z;
    }
  }
  else
  {
    if ( !prx.ParseError() )
      prx = ON_ParseSettings::FalseSettings;
    if ( !pry.ParseError() )
      pry = ON_ParseSettings::FalseSettings;
    if ( !prz.ParseError() )
      prz = ON_ParseSettings::FalseSettings;
  }

  if ( parse_results )
  {
    *parse_results = (prx || pry || prz);
  }

  return str_index;
}